

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>,FastPForLib::VariableByte>::
name_abi_cxx11_(CompositeCodec<FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  OPTPFor<4U,_FastPForLib::Simple16<false>_> *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_80 [8];
  VariableByte *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_(in_stack_00000028);
  std::operator+(__lhs,(char *)in_RDI);
  VariableByte::name_abi_cxx11_(in_stack_ffffffffffffff88);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return __lhs;
}

Assistant:

std::string name() const override {
    return codec1.name() + "+" + codec2.name();
  }